

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr * xmlGetNsList(xmlDoc *doc,xmlNode *node)

{
  int iVar1;
  int local_3c;
  int local_38;
  int i;
  int maxns;
  int nbns;
  xmlNsPtr *ret;
  xmlNsPtr cur;
  xmlNode *node_local;
  xmlDoc *doc_local;
  
  _maxns = (xmlDoc *)0x0;
  i = 0;
  local_38 = 10;
  if ((node == (xmlNode *)0x0) || (cur = (xmlNsPtr)node, node->type == XML_NAMESPACE_DECL)) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    for (; cur != (xmlNsPtr)0x0; cur = (xmlNsPtr)cur->context) {
      if (cur->type == XML_ELEMENT_NODE) {
        for (ret = &(cur[2].next)->next; ret != (xmlNsPtr *)0x0; ret = &(*ret)->next) {
          if (_maxns == (xmlDoc *)0x0) {
            _maxns = (xmlDoc *)(*xmlMalloc)((long)(local_38 + 1) << 3);
            if (_maxns == (xmlDoc *)0x0) {
              xmlTreeErrMemory("getting namespace list");
              return (xmlNsPtr *)0x0;
            }
            (&_maxns->_private)[i] = (void *)0x0;
          }
          local_3c = 0;
          while (((local_3c < i &&
                  (ret[3] != *(xmlNsPtr *)((long)(&_maxns->_private)[local_3c] + 0x18))) &&
                 (iVar1 = xmlStrEqual((xmlChar *)ret[3],
                                      *(xmlChar **)((long)(&_maxns->_private)[local_3c] + 0x18)),
                 iVar1 == 0))) {
            local_3c = local_3c + 1;
          }
          if (i <= local_3c) {
            if (local_38 <= i) {
              local_38 = local_38 * 2;
              _maxns = (xmlDoc *)(*xmlRealloc)(_maxns,(long)(local_38 + 1) << 3);
              if (_maxns == (xmlDoc *)0x0) {
                xmlTreeErrMemory("getting namespace list");
                return (xmlNsPtr *)0x0;
              }
            }
            (&_maxns->_private)[i] = ret;
            (&_maxns->_private)[i + 1] = (void *)0x0;
            i = i + 1;
          }
        }
      }
    }
    doc_local = _maxns;
  }
  return (xmlNsPtr *)doc_local;
}

Assistant:

xmlNsPtr *
xmlGetNsList(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlNode *node)
{
    xmlNsPtr cur;
    xmlNsPtr *ret = NULL;
    int nbns = 0;
    int maxns = 10;
    int i;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE) {
            cur = node->nsDef;
            while (cur != NULL) {
                if (ret == NULL) {
                    ret =
                        (xmlNsPtr *) xmlMalloc((maxns + 1) *
                                               sizeof(xmlNsPtr));
                    if (ret == NULL) {
			xmlTreeErrMemory("getting namespace list");
                        return (NULL);
                    }
                    ret[nbns] = NULL;
                }
                for (i = 0; i < nbns; i++) {
                    if ((cur->prefix == ret[i]->prefix) ||
                        (xmlStrEqual(cur->prefix, ret[i]->prefix)))
                        break;
                }
                if (i >= nbns) {
                    if (nbns >= maxns) {
                        maxns *= 2;
                        ret = (xmlNsPtr *) xmlRealloc(ret,
                                                      (maxns +
                                                       1) *
                                                      sizeof(xmlNsPtr));
                        if (ret == NULL) {
			    xmlTreeErrMemory("getting namespace list");
                            return (NULL);
                        }
                    }
                    ret[nbns++] = cur;
                    ret[nbns] = NULL;
                }

                cur = cur->next;
            }
        }
        node = node->parent;
    }
    return (ret);
}